

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

_Bool rf_image_get_pixels_as_normalized_to_buffer(rf_image image,rf_vec4 *dst,rf_int dst_size)

{
  rf_source_location source_location;
  _Bool _Var1;
  int iVar2;
  int iVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  long in_FS_OFFSET;
  
  if (image.format - RF_UNCOMPRESSED_GRAYSCALE < 10) {
    if (image.format - RF_UNCOMPRESSED_R32 < 3) {
      rf_log_impl(4,0x17c9bc);
    }
    iVar2 = rf_bits_per_pixel(image.format);
    iVar2 = iVar2 * image.height * image.width;
    iVar3 = iVar2 + 7;
    if (-1 < iVar2) {
      iVar3 = iVar2;
    }
    _Var1 = rf_format_pixels_to_normalized
                      (image.data,(long)(iVar3 >> 3),RF_UNCOMPRESSED_NORMALIZED,dst,dst_size);
    return _Var1;
  }
  source_location.proc_name._0_4_ = 0x17c990;
  source_location.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  source_location.proc_name._4_4_ = 0;
  source_location.line_in_file = 0x3bab;
  rf_log_impl(source_location,RF_LOG_TYPE_ERROR,
              "Function only works for uncompressed formats but was called with format %d.",1,
              (ulong)image.format,in_R8,in_R9,
              "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
              ,"rf_image_get_pixels_as_normalized_to_buffer",0x3bab);
  *(char **)(in_FS_OFFSET + -0x450) =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  *(char **)(in_FS_OFFSET + -0x448) = "rf_image_get_pixels_as_normalized_to_buffer";
  *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x3bab;
  *(undefined4 *)(in_FS_OFFSET + -0x438) = 1;
  return false;
}

Assistant:

RF_API bool rf_image_get_pixels_as_normalized_to_buffer(rf_image image, rf_vec4* dst, rf_int dst_size)
{
    bool success = false;

    if (rf_is_uncompressed_format(image.format))
    {
        if ((image.format == RF_UNCOMPRESSED_R32) || (image.format == RF_UNCOMPRESSED_R32G32B32) || (image.format == RF_UNCOMPRESSED_R32G32B32A32))
        {
            RF_LOG(RF_LOG_TYPE_WARNING, "32bit pixel format converted to 8bit per channel");
        }

        success = rf_format_pixels_to_normalized(image.data, rf_image_size(image), RF_UNCOMPRESSED_R32G32B32A32, dst, dst_size);
    }
    else RF_LOG_ERROR(RF_BAD_ARGUMENT, "Function only works for uncompressed formats but was called with format %d.", image.format);

    return success;
}